

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  testing::InitGoogleTest((int *)&argv_local,argv);
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    //MPI_Init(&argc, &argv);

    #ifdef WITH_CUDA
    // if testing with CUDA turned on, first check that we can initialize CUDA
    if(!initialize_cuda()) {
        std::cerr << "ERROR: unable to initialize CUDA" << std::endl;
        return 1;
    }
    #endif

    ::testing::InitGoogleTest(&argc, argv);
    return RUN_ALL_TESTS();
    //MPI_Finalize();
}